

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_utils.cc
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall lf::base::InitLogger(base *this,string *name)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar1;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> local_38;
  unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>
  local_30;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_28;
  undefined1 local_19;
  string *local_18;
  string *name_local;
  shared_ptr<spdlog::logger> *result;
  
  local_19 = 0;
  local_18 = name;
  name_local = (string *)this;
  spdlog::stdout_color_mt<spdlog::synchronous_factory>((spdlog *)this,name,automatic);
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  std::make_unique<spdlog::pattern_formatter>();
  std::
  make_unique<lf::base::LineFeedFormatter,std::unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>>>
            ((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)&local_30);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<lf::base::LineFeedFormatter,std::default_delete<lf::base::LineFeedFormatter>,void>
            ((unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>> *)&local_28,
             &local_30);
  spdlog::logger::set_formatter(this_00,&local_28);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>::
  ~unique_ptr(&local_30);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr(&local_38);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<spdlog::logger> InitLogger(const std::string& name) {
  auto result = spdlog::stdout_color_mt(name);
  result->set_formatter(std::make_unique<LineFeedFormatter>(
      std::make_unique<spdlog::pattern_formatter>()));
  return result;
}